

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall
coins_tests::updatecoins_simulation_test::test_method(updatecoins_simulation_test *this)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  pointer ppVar8;
  size_type sVar9;
  reference ppVar10;
  pointer pCVar11;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<COutPoint>,_bool> pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>,_bool>
  pVar13;
  uint flushIndex;
  Coin *coin_1;
  bool have;
  pair<const_COutPoint,_Coin> *entry;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *__range3;
  COutPoint *out;
  Coin *orig_coin;
  CTxUndo *undo_1;
  CTransaction *tx_1;
  int height;
  uint32_t randiter;
  uint i;
  bool spent_a_duplicate_coinbase;
  CCoinsView *tip;
  iterator __end3;
  iterator __begin3;
  iterator utxod_3;
  CTxUndo undo;
  iterator utxod_2;
  iterator utxod_1;
  iterator utxod;
  CMutableTransaction tx;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  Coin coin;
  COutPoint outpoint;
  COutPoint prevout;
  Coin old_coin;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> utxoset;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> duplicate_coins;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> disconnected_coins;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> coinbase_coins;
  CCoinsViewTest base;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  CTransaction *in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff230;
  size_type in_stack_fffffffffffff234;
  undefined7 in_stack_fffffffffffff238;
  undefined1 in_stack_fffffffffffff23f;
  CCoinsViewCache *in_stack_fffffffffffff240;
  UpdateTest *in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff250;
  int in_stack_fffffffffffff254;
  CCoinsViewCache *in_stack_fffffffffffff258;
  undefined7 in_stack_fffffffffffff260;
  undefined1 in_stack_fffffffffffff267;
  CTransaction *in_stack_fffffffffffff268;
  uint local_ab8;
  const_string local_a98 [2];
  lazy_ostream local_a78 [2];
  assertion_result local_a58 [2];
  pointer local_a18;
  const_string local_a10 [2];
  lazy_ostream local_9f0 [2];
  assertion_result local_9d0 [2];
  const_string local_998 [2];
  lazy_ostream local_978 [2];
  assertion_result local_958 [2];
  _Base_ptr local_920;
  _Base_ptr local_918;
  _Base_ptr local_910;
  const_string local_908 [2];
  lazy_ostream local_8e8 [2];
  assertion_result local_8c8 [2];
  const_string local_890 [2];
  lazy_ostream local_870 [2];
  assertion_result local_850 [2];
  _Base_ptr local_818;
  _Base_ptr local_810;
  const_string local_808 [2];
  lazy_ostream local_7e8 [2];
  assertion_result local_7c8 [2];
  _Base_ptr local_790;
  _Base_ptr local_770;
  _Base_ptr local_730;
  _Base_ptr local_6f0;
  undefined1 local_6e1;
  undefined1 *local_6a8;
  _Base_ptr local_680;
  undefined1 local_678;
  _Base_ptr local_670;
  undefined1 local_668;
  _Base_ptr local_660;
  undefined1 local_658;
  _Base_ptr local_650;
  undefined1 local_648;
  _Base_ptr local_640;
  undefined1 local_638;
  _Base_ptr local_630;
  undefined1 local_628;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  uint32_t local_258;
  ListNode *local_8;
  
  local_8 = *(ListNode **)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest
            (&in_stack_fffffffffffff248->super_BasicTestingSetup,
             (SeedRand)((ulong)in_stack_fffffffffffff240 >> 0x20));
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
       *)in_stack_fffffffffffff228);
  anon_unknown.dwarf_34a75b::CCoinsViewTest::CCoinsViewTest
            ((CCoinsViewTest *)in_stack_fffffffffffff248,
             (FastRandomContext *)in_stack_fffffffffffff240);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            *)in_stack_fffffffffffff228);
  local_6a8 = &stack0xffffffffffffff68;
  std::
  make_unique<(anonymous_namespace)::CCoinsViewCacheTest,(anonymous_namespace)::CCoinsViewTest*>
            ((CCoinsViewTest **)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               *)in_stack_fffffffffffff228,(value_type *)0x5072d7);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_fffffffffffff228);
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_fffffffffffff228);
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_fffffffffffff228);
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_fffffffffffff228);
  local_ab8 = 0;
  do {
    if (39999 < local_ab8) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (unsigned_long)in_stack_fffffffffffff228);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff228);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff268,
                   (const_string *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260),
                   (size_t)in_stack_fffffffffffff258,
                   (const_string *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238)
                   ,SUB41(in_stack_fffffffffffff234 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (unsigned_long)in_stack_fffffffffffff228);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff228);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (unsigned_long)in_stack_fffffffffffff228);
        in_stack_fffffffffffff228 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_a58,local_a78,local_a98,0x1fe,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff228);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff228);
        in_stack_fffffffffffff23f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff23f);
      std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::~set
                ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                 in_stack_fffffffffffff228);
      std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::~set
                ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                 in_stack_fffffffffffff228);
      std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::~set
                ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                 in_stack_fffffffffffff228);
      std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::~set
                ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                 in_stack_fffffffffffff228);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
      anon_unknown.dwarf_34a75b::CCoinsViewTest::~CCoinsViewTest
                ((CCoinsViewTest *)in_stack_fffffffffffff228);
      std::
      map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              *)in_stack_fffffffffffff228);
      if (*(ListNode **)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    uVar3 = RandomMixin<FastRandomContext>::rand32
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228);
    if (uVar3 % 0x14 < 0x13) {
      CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff228);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff248,
                 (size_type)in_stack_fffffffffffff240);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff248,
                 (size_type)in_stack_fffffffffffff240);
      pvVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                         ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                          CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                          CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
      pvVar5->nValue = (ulong)local_ab8;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                 CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                 CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
      RandomMixin<FastRandomContext>::rand32
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228);
      local_6e1 = 0;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                 in_stack_fffffffffffff234,(uchar *)in_stack_fffffffffffff228);
      RandomMixin<FastRandomContext>::rand32
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228);
      Coin::Coin((Coin *)in_stack_fffffffffffff228);
      if ((uVar3 % 0x14 < 2) ||
         (sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                             in_stack_fffffffffffff228), sVar6 < 10)) {
        iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                          ((RandomMixin<FastRandomContext> *)
                           CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                           (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
        if ((iVar4 == 0) &&
           (sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                              ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff228), sVar6 != 0)) {
          local_6f0 = (_Base_ptr)
                      UpdateTest::FindRandomFrom
                                (in_stack_fffffffffffff248,
                                 (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *
                                 )in_stack_fffffffffffff240);
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                      *)in_stack_fffffffffffff228);
          std::get<0ul,CTransaction,CTxUndo,Coin>
                    ((tuple<CTransaction,_CTxUndo,_Coin> *)in_stack_fffffffffffff228);
          CMutableTransaction::CMutableTransaction
                    ((CMutableTransaction *)in_stack_fffffffffffff258,
                     (CTransaction *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
          CMutableTransaction::operator=
                    ((CMutableTransaction *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (CMutableTransaction *)
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          CMutableTransaction::~CMutableTransaction
                    ((CMutableTransaction *)in_stack_fffffffffffff228);
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                      *)in_stack_fffffffffffff228);
          std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::erase
                    ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (key_type *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                      *)in_stack_fffffffffffff228);
          pVar12 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::insert
                             ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                              (value_type *)
                              CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          local_630 = (_Base_ptr)pVar12.first._M_node;
          local_628 = pVar12.second;
        }
        else {
          CMutableTransaction::GetHash((CMutableTransaction *)in_stack_fffffffffffff248);
          COutPoint::COutPoint
                    ((COutPoint *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (Txid *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (uint32_t)((ulong)in_stack_fffffffffffff228 >> 0x20));
          pVar12 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::insert
                             ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                              (value_type *)
                              CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          local_640 = (_Base_ptr)pVar12.first._M_node;
          local_638 = pVar12.second;
        }
        CTransaction::CTransaction
                  (in_stack_fffffffffffff268,
                   (CMutableTransaction *)
                   CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
        bVar1 = CTransaction::IsCoinBase
                          ((CTransaction *)
                           CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        if (!bVar1) {
          __assert_fail("CTransaction(tx).IsCoinBase()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                        ,0x170,"void coins_tests::updatecoins_simulation_test::test_method()");
        }
        CTransaction::~CTransaction(in_stack_fffffffffffff228);
LAB_00507c9d:
        sVar9 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                          ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff228);
        if (sVar9 != 1) {
          __assert_fail("tx.vout.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                        ,0x1a1,"void coins_tests::updatecoins_simulation_test::test_method()");
        }
        CMutableTransaction::GetHash((CMutableTransaction *)in_stack_fffffffffffff248);
        COutPoint::COutPoint
                  ((COutPoint *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (Txid *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (uint32_t)((ulong)in_stack_fffffffffffff228 >> 0x20));
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        CTransaction::CTransaction
                  (in_stack_fffffffffffff268,
                   (CMutableTransaction *)
                   CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
        CTransaction::IsCoinBase
                  ((CTransaction *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        Coin::Coin((Coin *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (CTxOut *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (int)((ulong)in_stack_fffffffffffff228 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff228 >> 0x18,0));
        std::
        map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                      *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                     (key_type *)in_stack_fffffffffffff248);
        Coin::operator=((Coin *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                        (Coin *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        Coin::~Coin((Coin *)in_stack_fffffffffffff228);
        CTransaction::~CTransaction(in_stack_fffffffffffff228);
        CTxUndo::CTxUndo((CTxUndo *)in_stack_fffffffffffff228);
        CTransaction::CTransaction
                  (in_stack_fffffffffffff268,
                   (CMutableTransaction *)
                   CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff228);
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator*((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        UpdateCoins(in_stack_fffffffffffff268,
                    (CCoinsViewCache *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260)
                    ,(CTxUndo *)in_stack_fffffffffffff258,in_stack_fffffffffffff254);
        CTransaction::~CTransaction(in_stack_fffffffffffff228);
        pVar12 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::insert
                           ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                            CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        local_650 = (_Base_ptr)pVar12.first._M_node;
        local_648 = pVar12.second;
        std::make_tuple<CMutableTransaction&,CTxUndo&,Coin&>
                  ((CMutableTransaction *)in_stack_fffffffffffff240,
                   (CTxUndo *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (Coin *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        pVar13 = std::
                 map<COutPoint,std::tuple<CTransaction,CTxUndo,Coin>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,std::tuple<CTransaction,CTxUndo,Coin>>>>
                 ::emplace<COutPoint_const&,std::tuple<CMutableTransaction,CTxUndo,Coin>>
                           ((map<COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>_>
                             *)in_stack_fffffffffffff248,(COutPoint *)in_stack_fffffffffffff240,
                            (tuple<CMutableTransaction,_CTxUndo,_Coin> *)
                            CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        local_660 = (_Base_ptr)pVar13.first._M_node;
        local_658 = pVar13.second;
        std::tuple<CMutableTransaction,_CTxUndo,_Coin>::~tuple
                  ((tuple<CMutableTransaction,_CTxUndo,_Coin> *)in_stack_fffffffffffff228);
        CTxUndo::~CTxUndo((CTxUndo *)in_stack_fffffffffffff228);
        bVar1 = false;
      }
      else {
        COutPoint::COutPoint((COutPoint *)in_stack_fffffffffffff228);
        if ((uVar3 % 0x14 != 2) ||
           (sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                              ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff228), sVar6 == 0)) {
          local_770 = (_Base_ptr)
                      UpdateTest::FindRandomFrom
                                (in_stack_fffffffffffff248,
                                 (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *
                                 )in_stack_fffffffffffff240);
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                                 *)in_stack_fffffffffffff228);
          local_258 = (ppVar8->first).n;
          local_278 = *(undefined8 *)
                       (ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uStack_270 = *(undefined8 *)
                        ((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_268 = *(undefined8 *)
                       ((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
          ;
          uStack_260 = *(undefined8 *)
                        ((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
          pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                             ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                              CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                              CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          (pvVar7->prevout).n = local_258;
          *(undefined8 *)
           ((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
               local_268;
          *(undefined8 *)
           ((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
               uStack_260;
          *(undefined8 *)(pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
               local_278;
          *(undefined8 *)
           ((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uStack_270
          ;
          CTransaction::CTransaction
                    (in_stack_fffffffffffff268,
                     (CMutableTransaction *)
                     CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
          bVar1 = CTransaction::IsCoinBase
                            ((CTransaction *)
                             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            __assert_fail("!CTransaction(tx).IsCoinBase()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                          ,400,"void coins_tests::updatecoins_simulation_test::test_method()");
          }
          CTransaction::~CTransaction(in_stack_fffffffffffff228);
LAB_00507beb:
          std::
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                        *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                       (key_type *)in_stack_fffffffffffff248);
          Coin::operator=((Coin *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                          (Coin *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                        *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                       (key_type *)in_stack_fffffffffffff248);
          Coin::Clear((Coin *)in_stack_fffffffffffff228);
          std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::erase
                    ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (key_type *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                    ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (key_type *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          goto LAB_00507c9d;
        }
        local_730 = (_Base_ptr)
                    UpdateTest::FindRandomFrom
                              (in_stack_fffffffffffff248,
                               (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff240);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::get<0ul,CTransaction,CTxUndo,Coin>
                  ((tuple<CTransaction,_CTxUndo,_Coin> *)in_stack_fffffffffffff228);
        CMutableTransaction::CMutableTransaction
                  ((CMutableTransaction *)in_stack_fffffffffffff258,
                   (CTransaction *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
        CMutableTransaction::operator=
                  ((CMutableTransaction *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (CMutableTransaction *)
                   CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff228);
        pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                           ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                            CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                            CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        local_258 = (pvVar7->prevout).n;
        local_278 = *(undefined8 *)
                     (pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uStack_270 = *(undefined8 *)
                      ((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_268 = *(undefined8 *)
                     ((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
        ;
        uStack_260 = *(undefined8 *)
                      ((pvVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                      );
        CTransaction::CTransaction
                  (in_stack_fffffffffffff268,
                   (CMutableTransaction *)
                   CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
        bVar2 = CTransaction::IsCoinBase
                          ((CTransaction *)
                           CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        bVar1 = false;
        if (!bVar2) {
          sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          bVar1 = sVar6 == 0;
        }
        CTransaction::~CTransaction(in_stack_fffffffffffff228);
        if (!bVar1) {
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                      *)in_stack_fffffffffffff228);
          sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          if (sVar6 != 0) {
            CTransaction::CTransaction
                      (in_stack_fffffffffffff268,
                       (CMutableTransaction *)
                       CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
            bVar1 = CTransaction::IsCoinBase
                              ((CTransaction *)
                               CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
            if (!bVar1) {
              __assert_fail("CTransaction(tx).IsCoinBase()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,0x183,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
            CTransaction::~CTransaction(in_stack_fffffffffffff228);
            std::
            _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                          *)in_stack_fffffffffffff228);
            sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::count
                              ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
            if (sVar6 == 0) {
              __assert_fail("duplicate_coins.count(utxod->first)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                            ,0x184,"void coins_tests::updatecoins_simulation_test::test_method()");
            }
          }
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                      *)in_stack_fffffffffffff228);
          std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::erase
                    ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (key_type *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          goto LAB_00507beb;
        }
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::erase
                  ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (key_type *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        bVar1 = true;
      }
      Coin::~Coin((Coin *)in_stack_fffffffffffff228);
      CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff228);
      if (!bVar1) goto LAB_00508563;
    }
    else {
      sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                        ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                         in_stack_fffffffffffff228);
      if (sVar6 != 0) {
        local_790 = (_Base_ptr)
                    UpdateTest::FindRandomFrom
                              (in_stack_fffffffffffff248,
                               (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff240);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::get<0ul,CTransaction,CTxUndo,Coin>
                  ((tuple<CTransaction,_CTxUndo,_Coin> *)in_stack_fffffffffffff228);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::get<1ul,CTransaction,CTxUndo,Coin>
                  ((tuple<CTransaction,_CTxUndo,_Coin> *)in_stack_fffffffffffff228);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::get<2ul,CTransaction,CTxUndo,Coin>
                  ((tuple<CTransaction,_CTxUndo,_Coin> *)in_stack_fffffffffffff228);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::
        map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                      *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                     (key_type *)in_stack_fffffffffffff248);
        Coin::Clear((Coin *)in_stack_fffffffffffff228);
        bVar1 = CTransaction::IsCoinBase
                          ((CTransaction *)
                           CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        if (!bVar1) {
          std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                        *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                       (key_type *)in_stack_fffffffffffff248);
          Coin::operator=((Coin *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                          (Coin *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        }
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (unsigned_long)in_stack_fffffffffffff228);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff228);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_fffffffffffff268,
                     (const_string *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260),
                     (size_t)in_stack_fffffffffffff258,
                     (const_string *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_fffffffffffff228);
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        *)in_stack_fffffffffffff228);
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                      *)in_stack_fffffffffffff228);
          CCoinsViewCache::SpendCoin
                    (in_stack_fffffffffffff258,
                     (COutPoint *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                     (Coin *)in_stack_fffffffffffff248);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     SUB41(in_stack_fffffffffffff234 >> 0x18,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (unsigned_long)in_stack_fffffffffffff228);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff228);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (unsigned_long)in_stack_fffffffffffff228);
          in_stack_fffffffffffff228 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_7c8,local_7e8,local_808,0x1c1,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff228);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff228);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        bVar1 = CTransaction::IsCoinBase
                          ((CTransaction *)
                           CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        if (!bVar1) {
          std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::vector<Coin,_std::allocator<Coin>_>::operator[]
                    ((vector<Coin,_std::allocator<Coin>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          Coin::Coin((Coin *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (Coin *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_fffffffffffff228);
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator*((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                       *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
          ApplyTxInUndo((Coin *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                        (CCoinsViewCache *)in_stack_fffffffffffff248,
                        (COutPoint *)in_stack_fffffffffffff240);
          Coin::~Coin((Coin *)in_stack_fffffffffffff228);
        }
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        pVar12 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::insert
                           ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                            CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        local_670 = (_Base_ptr)pVar12.first._M_node;
        local_668 = pVar12.second;
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::erase
                  ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                   CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                   (key_type *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        bVar1 = CTransaction::IsCoinBase
                          ((CTransaction *)
                           CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        if (!bVar1) {
          std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          pVar12 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::insert
                             ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                              CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                              (value_type *)
                              CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          local_680 = (_Base_ptr)pVar12.first._M_node;
          local_678 = pVar12.second;
        }
      }
LAB_00508563:
      iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                         (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      if ((iVar4 == 1) || (local_ab8 == 39999)) {
        local_810 = (_Base_ptr)
                    std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::begin((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                             *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        local_818 = (_Base_ptr)
                    std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::end((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                           *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff23f,
                                                         in_stack_fffffffffffff238),
                                       (_Self *)CONCAT44(in_stack_fffffffffffff234,
                                                         in_stack_fffffffffffff230)),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          ppVar10 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator*
                              ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)
                               in_stack_fffffffffffff228);
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_fffffffffffff228);
          pCVar11 = std::
                    unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                  *)in_stack_fffffffffffff228);
          (*(pCVar11->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView.
            _vptr_CCoinsView[1])(pCVar11,ppVar10);
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_fffffffffffff228);
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        *)in_stack_fffffffffffff228);
          CCoinsViewCache::AccessCoin
                    ((CCoinsViewCache *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (COutPoint *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff228);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_fffffffffffff268,
                       (const_string *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260)
                       ,(size_t)in_stack_fffffffffffff258,
                       (const_string *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250)
                      );
            Coin::IsSpent((Coin *)in_stack_fffffffffffff228);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       SUB41(in_stack_fffffffffffff234 >> 0x18,0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff228);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            in_stack_fffffffffffff228 = (CTransaction *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_850,local_870,local_890,0x1d6,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff228);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff228);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar1);
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff228);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_fffffffffffff268,
                       (const_string *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260)
                       ,(size_t)in_stack_fffffffffffff258,
                       (const_string *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250)
                      );
            anon_unknown.dwarf_34a75b::operator==
                      ((Coin *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (Coin *)in_stack_fffffffffffff228);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       SUB41(in_stack_fffffffffffff234 >> 0x18,0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff228);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            in_stack_fffffffffffff228 = (CTransaction *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_8c8,local_8e8,local_908,0x1d7,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff228);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff228);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar1);
          std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator++
                    ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)
                     in_stack_fffffffffffff228);
        }
      }
      sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                        ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                         in_stack_fffffffffffff228);
      if ((1 < sVar6) &&
         (iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                            ((RandomMixin<FastRandomContext> *)
                             CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                             (int)((ulong)in_stack_fffffffffffff248 >> 0x20)), iVar4 == 0)) {
        RandomMixin<FastRandomContext>::rand32
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff228);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff228);
        local_910 = (_Base_ptr)
                    UpdateTest::FindRandomFrom
                              (in_stack_fffffffffffff248,
                               (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff240);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        CCoinsViewCache::Uncache
                  (in_stack_fffffffffffff240,
                   (COutPoint *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
      }
      sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                        ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                         in_stack_fffffffffffff228);
      if ((1 < sVar6) &&
         (iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                            ((RandomMixin<FastRandomContext> *)
                             CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                             (int)((ulong)in_stack_fffffffffffff248 >> 0x20)), iVar4 == 0)) {
        RandomMixin<FastRandomContext>::rand32
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff228);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff228);
        local_918 = (_Base_ptr)
                    UpdateTest::FindRandomFrom
                              (in_stack_fffffffffffff248,
                               (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff240);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        CCoinsViewCache::Uncache
                  (in_stack_fffffffffffff240,
                   (COutPoint *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
      }
      sVar6 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::size
                        ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                         in_stack_fffffffffffff228);
      if ((1 < sVar6) &&
         (iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                            ((RandomMixin<FastRandomContext> *)
                             CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                             (int)((ulong)in_stack_fffffffffffff248 >> 0x20)), iVar4 == 0)) {
        RandomMixin<FastRandomContext>::rand32
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff228);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff228);
        local_920 = (_Base_ptr)
                    UpdateTest::FindRandomFrom
                              (in_stack_fffffffffffff248,
                               (set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                               in_stack_fffffffffffff240);
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::tuple<CTransaction,_CTxUndo,_Coin>_>_>
                    *)in_stack_fffffffffffff228);
        CCoinsViewCache::Uncache
                  (in_stack_fffffffffffff240,
                   (COutPoint *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
      }
      iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                         (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      if (((iVar4 == 0) &&
          (sVar9 = std::
                   vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                           *)in_stack_fffffffffffff228), 1 < sVar9)) &&
         (bVar1 = RandomMixin<FastRandomContext>::randbool
                            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228), !bVar1))
      {
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff228);
        RandomMixin<FastRandomContext>::randrange<unsigned_long>
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                   (unsigned_long)in_stack_fffffffffffff248);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (unsigned_long)in_stack_fffffffffffff228);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff228);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_fffffffffffff268,
                     (const_string *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260),
                     (size_t)in_stack_fffffffffffff258,
                     (const_string *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        *)in_stack_fffffffffffff228);
          CCoinsViewCache::Flush
                    ((CCoinsViewCache *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     SUB41(in_stack_fffffffffffff234 >> 0x18,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (unsigned_long)in_stack_fffffffffffff228);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff228);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                     (unsigned_long)in_stack_fffffffffffff228);
          in_stack_fffffffffffff228 = (CTransaction *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_958,local_978,local_998,0x1ea,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff228);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff228);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                         (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      if (iVar4 == 0) {
        sVar9 = std::
                vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)in_stack_fffffffffffff228);
        if ((sVar9 != 0) &&
           (bVar1 = RandomMixin<FastRandomContext>::randbool
                              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228), !bVar1)
           ) {
          do {
            in_stack_fffffffffffff268 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff228);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_fffffffffffff268,
                       (const_string *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260)
                       ,(size_t)in_stack_fffffffffffff258,
                       (const_string *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250)
                      );
            std::
            vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff228);
            std::
            unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          *)in_stack_fffffffffffff228);
            in_stack_fffffffffffff267 =
                 CCoinsViewCache::Flush
                           ((CCoinsViewCache *)
                            CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       SUB41(in_stack_fffffffffffff234 >> 0x18,0));
            in_stack_fffffffffffff258 =
                 (CCoinsViewCache *)boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff228);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                       (pointer)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (unsigned_long)in_stack_fffffffffffff228);
            in_stack_fffffffffffff228 = (CTransaction *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_9d0,local_9f0,local_a10,0x1f0,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff228);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff228);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
            in_stack_fffffffffffff254 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff254);
          } while (bVar1);
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::pop_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)in_stack_fffffffffffff228);
        }
        sVar9 = std::
                vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)in_stack_fffffffffffff228);
        if ((sVar9 == 0) ||
           ((sVar9 = std::
                     vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                     ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                             *)in_stack_fffffffffffff228), sVar9 < 4 &&
            (bVar1 = RandomMixin<FastRandomContext>::randbool
                               ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff228), bVar1)
            ))) {
          local_a18 = (pointer)&stack0xffffffffffffff68;
          sVar9 = std::
                  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                          *)in_stack_fffffffffffff228);
          if (sVar9 != 0) {
            std::
            vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff228);
            local_a18 = std::
                        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        ::get((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                               *)in_stack_fffffffffffff228);
          }
          std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsView*&>
                    ((CCoinsView **)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250));
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       *)in_stack_fffffffffffff228,(value_type *)0x50920c);
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                         *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238));
        }
      }
    }
    local_ab8 = local_ab8 + 1;
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(updatecoins_simulation_test, UpdateTest)
{
    SeedRandomForTest(SeedRand::ZEROS);

    bool spent_a_duplicate_coinbase = false;
    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    CCoinsViewTest base{m_rng}; // A CCoinsViewTest at the bottom.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(&base)); // Start with one cache.

    // Track the txids we've used in various sets
    std::set<COutPoint> coinbase_coins;
    std::set<COutPoint> disconnected_coins;
    std::set<COutPoint> duplicate_coins;
    std::set<COutPoint> utxoset;

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        uint32_t randiter = m_rng.rand32();

        // 19/20 txs add a new transaction
        if (randiter % 20 < 19) {
            CMutableTransaction tx;
            tx.vin.resize(1);
            tx.vout.resize(1);
            tx.vout[0].nValue = i; //Keep txs unique unless intended to duplicate
            tx.vout[0].scriptPubKey.assign(m_rng.rand32() & 0x3F, 0); // Random sizes so we can test memory usage accounting
            const int height{int(m_rng.rand32() >> 1)};
            Coin old_coin;

            // 2/20 times create a new coinbase
            if (randiter % 20 < 2 || coinbase_coins.size() < 10) {
                // 1/10 of those times create a duplicate coinbase
                if (m_rng.randrange(10) == 0 && coinbase_coins.size()) {
                    auto utxod = FindRandomFrom(coinbase_coins);
                    // Reuse the exact same coinbase
                    tx = CMutableTransaction{std::get<0>(utxod->second)};
                    // shouldn't be available for reconnection if it's been duplicated
                    disconnected_coins.erase(utxod->first);

                    duplicate_coins.insert(utxod->first);
                }
                else {
                    coinbase_coins.insert(COutPoint(tx.GetHash(), 0));
                }
                assert(CTransaction(tx).IsCoinBase());
            }

            // 17/20 times reconnect previous or add a regular tx
            else {

                COutPoint prevout;
                // 1/20 times reconnect a previously disconnected tx
                if (randiter % 20 == 2 && disconnected_coins.size()) {
                    auto utxod = FindRandomFrom(disconnected_coins);
                    tx = CMutableTransaction{std::get<0>(utxod->second)};
                    prevout = tx.vin[0].prevout;
                    if (!CTransaction(tx).IsCoinBase() && !utxoset.count(prevout)) {
                        disconnected_coins.erase(utxod->first);
                        continue;
                    }

                    // If this tx is already IN the UTXO, then it must be a coinbase, and it must be a duplicate
                    if (utxoset.count(utxod->first)) {
                        assert(CTransaction(tx).IsCoinBase());
                        assert(duplicate_coins.count(utxod->first));
                    }
                    disconnected_coins.erase(utxod->first);
                }

                // 16/20 times create a regular tx
                else {
                    auto utxod = FindRandomFrom(utxoset);
                    prevout = utxod->first;

                    // Construct the tx to spend the coins of prevouthash
                    tx.vin[0].prevout = prevout;
                    assert(!CTransaction(tx).IsCoinBase());
                }
                // In this simple test coins only have two states, spent or unspent, save the unspent state to restore
                old_coin = result[prevout];
                // Update the expected result of prevouthash to know these coins are spent
                result[prevout].Clear();

                utxoset.erase(prevout);

                // The test is designed to ensure spending a duplicate coinbase will work properly
                // if that ever happens and not resurrect the previously overwritten coinbase
                if (duplicate_coins.count(prevout)) {
                    spent_a_duplicate_coinbase = true;
                }

            }
            // Update the expected result to know about the new output coins
            assert(tx.vout.size() == 1);
            const COutPoint outpoint(tx.GetHash(), 0);
            result[outpoint] = Coin{tx.vout[0], height, CTransaction{tx}.IsCoinBase()};

            // Call UpdateCoins on the top cache
            CTxUndo undo;
            UpdateCoins(CTransaction{tx}, *(stack.back()), undo, height);

            // Update the utxo set for future spends
            utxoset.insert(outpoint);

            // Track this tx and undo info to use later
            utxoData.emplace(outpoint, std::make_tuple(tx,undo,old_coin));
        } else if (utxoset.size()) {
            //1/20 times undo a previous transaction
            auto utxod = FindRandomFrom(utxoset);

            CTransaction &tx = std::get<0>(utxod->second);
            CTxUndo &undo = std::get<1>(utxod->second);
            Coin &orig_coin = std::get<2>(utxod->second);

            // Update the expected result
            // Remove new outputs
            result[utxod->first].Clear();
            // If not coinbase restore prevout
            if (!tx.IsCoinBase()) {
                result[tx.vin[0].prevout] = orig_coin;
            }

            // Disconnect the tx from the current UTXO
            // See code in DisconnectBlock
            // remove outputs
            BOOST_CHECK(stack.back()->SpendCoin(utxod->first));
            // restore inputs
            if (!tx.IsCoinBase()) {
                const COutPoint &out = tx.vin[0].prevout;
                Coin coin = undo.vprevout[0];
                ApplyTxInUndo(std::move(coin), *(stack.back()), out);
            }
            // Store as a candidate for reconnection
            disconnected_coins.insert(utxod->first);

            // Update the utxoset
            utxoset.erase(utxod->first);
            if (!tx.IsCoinBase())
                utxoset.insert(tx.vin[0].prevout);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
            }
        }

        // One every 10 iterations, remove a random entry from the cache
        if (utxoset.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(utxoset)->first);
        }
        if (disconnected_coins.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(disconnected_coins)->first);
        }
        if (duplicate_coins.size() > 1 && m_rng.randrange(30) == 0) {
            stack[m_rng.rand32() % stack.size()]->Uncache(FindRandomFrom(duplicate_coins)->first);
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                BOOST_CHECK(stack[flushIndex]->Flush());
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                BOOST_CHECK(stack.back()->Flush());
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                CCoinsView* tip = &base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(spent_a_duplicate_coinbase);
}